

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O0

int32 read_kd_trees(char *infile,kd_tree_node_t ***out_trees,uint32 *out_n_trees)

{
  int iVar1;
  int32 iVar2;
  FILE *__stream;
  kd_tree_node_t **ppkVar3;
  kd_tree_node_t *node;
  kd_tree_node_t *tree;
  uint32 m;
  uint32 i;
  int version;
  int n;
  char line [256];
  FILE *fp;
  uint32 *out_n_trees_local;
  kd_tree_node_t ***out_trees_local;
  char *infile_local;
  
  __stream = fopen(infile,"r");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                   ,0x1d8,"Failed to open %s",infile);
    infile_local._4_4_ = -1;
  }
  else {
    i = __isoc99_fscanf(__stream,"%255s",&version);
    if ((i == 1) && (iVar1 = strcmp((char *)&version,"KD-TREES"), iVar1 == 0)) {
      i = __isoc99_fscanf(__stream,"%255s %d",&version);
      if (((i == 2) && (iVar1 = strcmp((char *)&version,"version"), iVar1 == 0)) && ((int)m < 2)) {
        iVar2 = read_tree_int((FILE *)__stream,"n_trees",out_n_trees,0);
        if (iVar2 < 0) {
          infile_local._4_4_ = -1;
        }
        else {
          ppkVar3 = (kd_tree_node_t **)
                    __ckd_calloc__((ulong)*out_n_trees,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                                   ,0x1e8);
          *out_trees = ppkVar3;
          for (tree._4_4_ = 0; tree._4_4_ < *out_n_trees; tree._4_4_ = tree._4_4_ + 1) {
            iVar2 = read_tree_int((FILE *)__stream,"TREE",(uint32 *)&tree,0);
            if (iVar2 < 0) {
LAB_00114090:
              fclose(__stream);
              for (tree._4_4_ = 0; tree._4_4_ < *out_n_trees; tree._4_4_ = tree._4_4_ + 1) {
                free_kd_tree((*out_trees)[tree._4_4_]);
                (*out_trees)[tree._4_4_] = (kd_tree_node_t *)0x0;
              }
              ckd_free(*out_trees);
              *out_trees = (kd_tree_node_t **)0x0;
              return -1;
            }
            if ((uint)tree != tree._4_4_) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                      ,0x1ef,"Tree number %u out of sequence\n",(ulong)(uint)tree);
              goto LAB_00114090;
            }
            node = (kd_tree_node_t *)
                   __ckd_calloc__(1,0x58,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                                  ,499);
            (*out_trees)[tree._4_4_] = node;
            iVar2 = read_tree_int((FILE *)__stream,"n_density",&node->n_density,0);
            if (((iVar2 < 0) ||
                (iVar2 = read_tree_int((FILE *)__stream,"n_comp",&node->n_comp,0), iVar2 < 0)) ||
               ((iVar2 = read_tree_int((FILE *)__stream,"n_level",&node->n_level,0), iVar2 < 0 ||
                ((iVar2 = read_tree_float((FILE *)__stream,"threshold",&node->threshold,0),
                 iVar2 < 0 ||
                 (iVar2 = read_kd_nodes((FILE *)__stream,node,node->n_level), iVar2 < 0))))))
            goto LAB_00114090;
          }
          fclose(__stream);
          infile_local._4_4_ = 0;
        }
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                ,0x1e2,"Unsupported kd-tree file format %s %d\n",&version,(ulong)m);
        infile_local._4_4_ = -1;
      }
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
              ,0x1dd,"Doesn\'t appear to be a kd-tree file: %s\n");
      infile_local._4_4_ = -1;
    }
  }
  return infile_local._4_4_;
}

Assistant:

int32
read_kd_trees(const char *infile, kd_tree_node_t ***out_trees, uint32 *out_n_trees)
{
	FILE *fp;
	char line[256];
	int n, version;
	uint32 i, m;

	if ((fp = fopen(infile, "r"))  == NULL) {
		E_ERROR_SYSTEM("Failed to open %s", infile);
		return -1;
	}
	n = fscanf(fp, "%255s", line);
	if (n != 1 || strcmp(line, "KD-TREES")) {
		E_ERROR("Doesn't appear to be a kd-tree file: %s\n");
		return -1;
	}
	n = fscanf(fp, "%255s %d", line, &version);
	if (n != 2 || strcmp(line, "version") || version > KDTREE_VERSION) {
		E_ERROR("Unsupported kd-tree file format %s %d\n", line, version);
		return -1;
	}
	if (read_tree_int(fp, "n_trees", out_n_trees, FALSE) < 0)
		return -1;

	*out_trees = ckd_calloc(*out_n_trees, sizeof(kd_tree_node_t **));
	for (i = 0; i < *out_n_trees; ++i) {
		kd_tree_node_t *tree;

		if (read_tree_int(fp, "TREE", &m, FALSE) < 0)
			goto error_out;
		if (m != i) {
			E_ERROR("Tree number %u out of sequence\n", m);
			goto error_out;
		}

		(*out_trees)[i] = tree = ckd_calloc(1, sizeof(*tree));
		if (read_tree_int(fp, "n_density", &tree->n_density, FALSE) < 0)
			goto error_out;
		if (read_tree_int(fp, "n_comp", &tree->n_comp, FALSE) < 0)
			goto error_out;
		if (read_tree_int(fp, "n_level", &tree->n_level, FALSE) < 0)
			goto error_out;
		if (read_tree_float(fp, "threshold", &tree->threshold, FALSE) < 0)
			goto error_out;
		if (read_kd_nodes(fp, tree, tree->n_level) < 0)
			goto error_out;
	}
	fclose(fp);
	return 0;

error_out:
	fclose(fp);
	for (i = 0; i < *out_n_trees; ++i) {
		free_kd_tree((*out_trees)[i]);
		(*out_trees)[i] = NULL;
	}
	ckd_free(*out_trees);
	*out_trees = NULL;
	return -1;
}